

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O2

bool tchecker::dbm::is_consistent(db_t *dbm,clock_id_t dim)

{
  ulong uVar1;
  uint uVar2;
  char *__assertion;
  ulong uVar3;
  ulong uVar4;
  
  if (dbm == (db_t *)0x0) {
    __assertion = "dbm != nullptr";
    uVar2 = 0x53;
  }
  else {
    if (dim != 0) {
      uVar2 = 0;
      uVar1 = 0;
      do {
        uVar3 = uVar1;
        if (dim == uVar3) break;
        uVar4 = (ulong)uVar2;
        uVar2 = uVar2 + dim + 1;
        uVar1 = uVar3 + 1;
      } while (dbm[uVar4] == (db_t)0x1);
      return dim <= uVar3;
    }
    __assertion = "dim >= 1";
    uVar2 = 0x54;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,uVar2,
                "bool tchecker::dbm::is_consistent(const tchecker::dbm::db_t *, tchecker::clock_id_t)"
               );
}

Assistant:

bool is_consistent(tchecker::dbm::db_t const * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    if (DBM(i, i) != tchecker::dbm::LE_ZERO)
      return false;
  return true;
}